

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffhist2e(fitsfile **fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],
            char **colexpr,double *minin,double *maxin,double *binsizein,char (*minname) [71],
            char (*maxname) [71],char (*binname) [71],double weightin,char *wtcol,char *wtexpr,
            int recip,char *selectrow,int *status)

{
  int iVar1;
  undefined1 local_2d0 [8];
  ParseData lParse;
  long naxes [5];
  long nelem;
  long lStack_1b0;
  int naxis1;
  long vectorRepeat;
  char errmsg [81];
  long wtrepeat;
  long *repeat;
  int local_138;
  int wtdatatype;
  int datatypes [4];
  fitsfile *pfStack_120;
  int numIterCols;
  double weight;
  double binsize [4];
  double amax [4];
  double amin [4];
  long haxes [4];
  int local_8c;
  int local_88;
  int wtcolnum;
  int colnum [4];
  fitsfile *pfStack_70;
  int bitpix;
  fitsfile *histptr;
  double weightin_local;
  char **colexpr_local;
  char (*colname_local) [71];
  int naxis_local;
  int imagetype_local;
  char *outfile_local;
  fitsfile **fptr_local;
  
  datatypes[3] = 0;
  repeat._4_4_ = 0;
  stack0xfffffffffffffeb0 = 0;
  if (0 < *status) {
    return *status;
  }
  histptr = (fitsfile *)weightin;
  weightin_local = (double)colexpr;
  colexpr_local = (char **)colname;
  colname_local._0_4_ = naxis;
  colname_local._4_4_ = imagetype;
  _naxis_local = outfile;
  outfile_local = (char *)fptr;
  if (naxis < 5) {
    if ((*fptr)->HDUposition != (*fptr)->Fptr->curhdu) {
      ffmahd(*fptr,(*fptr)->HDUposition + 1,(int *)0x0,status);
    }
    if (colname_local._4_4_ == 0xb) {
      colnum[3] = 8;
    }
    else if (colname_local._4_4_ == 0x15) {
      colnum[3] = 0x10;
    }
    else if (colname_local._4_4_ == 0x1f) {
      colnum[3] = 0x20;
    }
    else if (colname_local._4_4_ == 0x2a) {
      colnum[3] = -0x20;
    }
    else {
      if (colname_local._4_4_ != 0x52) {
        *status = 0x19a;
        goto LAB_0021c088;
      }
      colnum[3] = -0x40;
    }
    iVar1 = fits_calc_binningde(*(fitsfile **)outfile_local,(int)colname_local,
                                (char (*) [71])colexpr_local,(char **)weightin_local,minin,maxin,
                                binsizein,minname,maxname,binname,&local_88,&local_138,
                                (long *)(amin + 3),amax + 3,binsize + 3,&weight,
                                &stack0xfffffffffffffe50,status);
    if (iVar1 < 1) {
      if (*wtcol == '\0') {
        if ((wtexpr == (char *)0x0) || (*wtexpr == '\0')) {
          pfStack_120 = histptr;
          stack0xfffffffffffffeb0 = lStack_1b0;
          repeat._4_4_ = 0x52;
        }
        else {
          ffiprs(*(fitsfile **)outfile_local,0,wtexpr,5,(int *)((long)&repeat + 4),naxes + 4,
                 (int *)((long)&nelem + 4),(long *)&lParse.status,(ParseData *)local_2d0,status);
          ffcprs((ParseData *)local_2d0);
          if (naxes[4] < 0) {
            naxes[4] = 1;
          }
          pfStack_120 = (fitsfile *)0xb8a83e285ebab4b7;
          stack0xfffffffffffffeb0 = naxes[4];
        }
      }
      else {
        iVar1 = ffgky(*(fitsfile **)outfile_local,0x52,wtcol,&stack0xfffffffffffffee0,(char *)0x0,
                      status);
        if (iVar1 == 0) {
          repeat._4_4_ = 0x52;
          stack0xfffffffffffffeb0 = 1;
        }
        else {
          *status = 0;
          iVar1 = ffgcno(*(fitsfile **)outfile_local,0,wtcol,&local_8c,status);
          if (0 < iVar1) {
            ffpmsg("keyword or column for histogram weights doesn\'t exist: ");
            ffpmsg(wtcol);
            goto LAB_0021c088;
          }
          ffeqty(*(fitsfile **)outfile_local,local_8c,(int *)((long)&repeat + 4),
                 (long *)(errmsg + 0x50),(long *)0x0,status);
          pfStack_120 = (fitsfile *)0xb8a83e285ebab4b7;
        }
      }
      if ((((repeat._4_4_ < 0) || (repeat._4_4_ == 0x10)) || (repeat._4_4_ == 1)) ||
         (repeat._4_4_ == 0xe)) {
        ffpmsg("Invalid datatype for bin weighting factor");
        *status = 0x19a;
      }
      else if (stack0xfffffffffffffeb0 == lStack_1b0) {
        if ((0.0 < (double)pfStack_120) ||
           (((double)pfStack_120 == -9.1191291391491e-36 && (!NAN((double)pfStack_120))))) {
          if ((recip != 0) &&
             (((double)pfStack_120 != -9.1191291391491e-36 || (NAN((double)pfStack_120))))) {
            pfStack_120 = (fitsfile *)(1.0 / (double)pfStack_120);
          }
          iVar1 = ffinit(&stack0xffffffffffffff90,_naxis_local,status);
          if (iVar1 < 1) {
            iVar1 = ffcrim(pfStack_70,colnum[3],(int)colname_local,(long *)(amin + 3),status);
            if (iVar1 < 1) {
              iVar1 = fits_copy_pixlist2image
                                (*(fitsfile **)outfile_local,pfStack_70,9,(int)colname_local,
                                 &local_88,status);
              if (iVar1 < 1) {
                fits_write_keys_histoe
                          (*(fitsfile **)outfile_local,pfStack_70,(int)colname_local,&local_88,
                           (char (*) [71])colexpr_local,(char **)weightin_local,status);
                fits_rebin_wcsd(pfStack_70,(int)colname_local,amax + 3,&weight,status);
                iVar1 = fits_make_histde(*(fitsfile **)outfile_local,pfStack_70,&local_138,colnum[3]
                                         ,(int)colname_local,(long *)(amin + 3),&local_88,
                                         (char **)weightin_local,amax + 3,binsize + 3,&weight,
                                         (double)pfStack_120,local_8c,wtexpr,recip,selectrow,status)
                ;
                if (iVar1 < 1) {
                  ffclos(*(fitsfile **)outfile_local,status);
                  *(fitsfile **)outfile_local = pfStack_70;
                }
                else {
                  ffpmsg("failed to calculate new histogram values");
                }
              }
              else {
                ffpmsg("failed to copy pixel list keywords to new histogram header");
              }
            }
            else {
              ffpmsg("failed to create output histogram FITS image");
            }
          }
          else {
            ffpmsg("failed to create temp output file for histogram");
          }
        }
        else {
          ffpmsg("Illegal histogramming weighting factor <= 0.");
          *status = 0x7d;
        }
      }
      else {
        ffpmsg("Vector dimensions of weighting do not agree with binning columns");
        *status = 0x140;
      }
    }
    else {
      ffpmsg("failed to determine binning parameters");
    }
  }
  else {
    ffpmsg("histogram has more than 4 dimensions");
    *status = 0x140;
  }
LAB_0021c088:
  return *status;
}

Assistant:

int ffhist2e(fitsfile **fptr,  /* IO - pointer to table with X and Y cols;    */
                             /*     on output, points to histogram image    */
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
	   char *colexpr[4], /* I - optionally, expression intead of colum  */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
	   char *wtexpr,           /* I - optionally, weight expression     */
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    fitsfile *histptr;
    int   bitpix, colnum[4], wtcolnum;
    long haxes[4];
    double amin[4], amax[4], binsize[4],  weight;
    int numIterCols = 0;
    int datatypes[4], wtdatatype = 0;
    long *repeat, wtrepeat = 0;
    char errmsg[FLEN_ERRMSG];
    long vectorRepeat;

    if (*status > 0)
        return(*status);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        *status = BAD_DIMEN;
	goto cleanup;
    }

    /* reset position to the correct HDU if necessary */
    if ((*fptr)->HDUposition != ((*fptr)->Fptr)->curhdu)
        ffmahd(*fptr, ((*fptr)->HDUposition) + 1, NULL, status);

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else {
        *status = BAD_DATATYPE;
      	goto cleanup;
    }
    
    /*    Calculate the binning parameters:    */
    /*   columm numbers, axes length, min values,  max values, and binsizes.  */

    if (fits_calc_binningde(
      *fptr, naxis, colname, colexpr, 
      minin, maxin, binsizein, minname, maxname, binname,
      colnum, datatypes, haxes, amin, amax, binsize, 
      &vectorRepeat, status) > 0)
    {
        ffpmsg("failed to determine binning parameters");
      	goto cleanup;
    }
 
    /* get the histogramming weighting factor, if any */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (ffgky(*fptr, TDOUBLE, wtcol, &weight, NULL, status) == 0)
	{
	  /* Data type if keyword was found */
	  wtdatatype = TDOUBLE;
	  wtrepeat   = 1;
	}
	else
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(*fptr, CASEINSEN, wtcol, &wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
	       goto cleanup;
            }

	    /* get the datatype of the column */
	    fits_get_eqcoltype(*fptr, wtcolnum, &wtdatatype,
			       &wtrepeat, NULL, status);

            weight = DOUBLENULLVALUE;
        } 
    }
    else if (wtexpr && wtexpr[0])  /* A weighting expression - always TDOUBLE */
    {     
      /* Initialize the parser so that we can determine the datatype
	 of the returned type as well as the vector dimensions.  The
	 parsers is kept allocated so we can assemble an iterator that
	 uses it below.
      */
      int naxis1;
      long int nelem, naxes[MAXDIMS];
      ParseData lParse;

      ffiprs( *fptr, 0, wtexpr, MAXDIMS, &wtdatatype, &nelem, &naxis1,
	      naxes, &lParse, status );
      ffcprs( &lParse );
      if (nelem < 0) nelem = 1; /* If it's a constant expression */

      weight = DOUBLENULLVALUE;
      wtrepeat = nelem;
      wtdatatype = wtdatatype;

    }
    else
    {
        weight = (double) weightin;
	wtrepeat = vectorRepeat;
	wtdatatype = TDOUBLE;
    }

    /* Make sure weighting column is not an un-binnable data type */
    if (wtdatatype < 0 || wtdatatype == TSTRING || wtdatatype == TBIT || 
	wtdatatype == TLOGICAL) {
      ffpmsg("Invalid datatype for bin weighting factor");
      *status = BAD_DATATYPE;
      goto cleanup;
    }

    /* And dimensions of weighting must agree with input column data */
    if (wtrepeat != vectorRepeat) {
      ffpmsg("Vector dimensions of weighting do not agree with binning columns");
      *status = BAD_DIMEN;
      goto cleanup;
    }      

    if (weight <= 0. && weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        *status = URL_PARSE_ERROR;
	goto cleanup;
    }

    if (recip && weight != DOUBLENULLVALUE) {
       /* take reciprocal of weight */
       weight = (double) (1.0 / weight);
    }


    /* size of histogram is now known, so create temp output file */
    if (fits_create_file(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
	goto cleanup;
    }

    /* create output FITS image HDU */
    if (ffcrim(histptr, bitpix, naxis, haxes, status) > 0)
    {
        ffpmsg("failed to create output histogram FITS image");
	goto cleanup;
    }

    /* copy header keywords, converting pixel list WCS keywords to image WCS form */
    if (fits_copy_pixlist2image(*fptr, histptr, 9, naxis, colnum, status) > 0)
    {
        ffpmsg("failed to copy pixel list keywords to new histogram header");
	goto cleanup;
    }

    /* if the table columns have no WCS keywords, then write default keywords */
    fits_write_keys_histoe(*fptr, histptr, naxis, colnum, colname, colexpr, status);
    
    /* update the WCS keywords for the ref. pixel location, and pixel size */
    fits_rebin_wcsd(histptr, naxis, amin, binsize,  status);      
    
    /* now compute the output image by binning the column values */
    if (fits_make_histde(*fptr, histptr, datatypes, bitpix, naxis, haxes, 
			 colnum, colexpr, amin, amax, binsize,
			 weight, wtcolnum, wtexpr, recip, 
			 selectrow, status) > 0)
    {
        ffpmsg("failed to calculate new histogram values");
	goto cleanup;
    }
              
    /* finally, close the original file and return ptr to the new image */
    ffclos(*fptr, status);
    *fptr = histptr;

 cleanup:
    return(*status);
}